

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O2

void writenumber(uint i,FILE *fp)

{
  writebyte('2',fp);
  writebyte('4',fp);
  writebyte('0',fp);
  writebyte('6',fp);
  writebyte((byte)((ulong)(i - 24000) % 10) | 0x30,fp);
  return;
}

Assistant:

static void writenumber(unsigned int i, FILE *fp) {
	int c;
	c=i/10000;
	i-=c*10000;
	writebyte(c+48, fp);
	c=i/1000;
	i-=c*1000;
	writebyte(c+48, fp);
	c=i/100;
	i-=c*100;
	writebyte(c+48, fp);
	c=i/10;
	writebyte(c+48, fp);
	i%=10;
	writebyte(i+48, fp);
}